

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void sect_EndSection(void)

{
  if (currentSection == (Section *)0x0) {
    fatalerror("Cannot end the section outside of a SECTION\n");
  }
  if (currentLoadSection != (Section *)0x0) {
    fatalerror("Cannot end the section within a `LOAD` block\n");
  }
  if (unionStack != (UnionStackEntry *)0x0) {
    fatalerror("Cannot end the section within a UNION\n");
  }
  currentSection = (Section *)0x0;
  sym_SetCurrentSymbolScope((char *)0x0);
  return;
}

Assistant:

void sect_EndSection(void)
{
	if (!currentSection)
		fatalerror("Cannot end the section outside of a SECTION\n");

	if (currentLoadSection)
		fatalerror("Cannot end the section within a `LOAD` block\n");

	if (unionStack)
		fatalerror("Cannot end the section within a UNION\n");

	// Reset the section scope
	currentSection = NULL;
	sym_SetCurrentSymbolScope(NULL);
}